

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O0

void mf_repdata_do_replace(MF_REPLACEMENT_DATA_t *rd,size_t to_position)

{
  AC_ALPHABET_t *pAVar1;
  long *plVar2;
  AC_ALPHABET_t *in_RSI;
  AC_TEXT_t *in_RDI;
  size_t base_position;
  mf_replacement_nominee *nom;
  MF_REPLACEMENT_DATA_t *in_stack_00000010;
  uint index;
  uint local_14;
  
  pAVar1 = *(AC_ALPHABET_t **)(in_RDI[6].astring + 0x28);
  if (pAVar1 <= in_RSI) {
    if (in_RDI[3].length != 0) {
      local_14 = 0;
      while (((ulong)local_14 < in_RDI[3].length &&
             (plVar2 = (long *)(in_RDI[2].length + (ulong)local_14 * 0x10),
             (AC_ALPHABET_t *)(plVar2[1] - *(long *)(*plVar2 + 8)) < in_RSI))) {
        mf_repdata_appendfactor(in_stack_00000010,(size_t)nom,base_position);
        mf_repdata_appendtext((MF_REPLACEMENT_DATA_t *)base_position,in_RDI);
        in_RDI[4].astring = (AC_ALPHABET_t *)plVar2[1];
        local_14 = local_14 + 1;
      }
      in_RDI[3].length = in_RDI[3].length - (ulong)local_14;
      if ((in_RDI[3].length != 0) && (local_14 != 0)) {
        memcpy((void *)in_RDI[2].length,(void *)(in_RDI[2].length + (ulong)local_14 * 0x10),
               in_RDI[3].length << 4);
      }
    }
    if (in_RDI[4].astring < in_RSI) {
      mf_repdata_appendfactor(in_stack_00000010,(size_t)nom,base_position);
      in_RDI[4].astring = in_RSI;
    }
    if (pAVar1 <= in_RDI[4].astring) {
      in_RDI[1].length = 0;
    }
  }
  return;
}

Assistant:

static void mf_repdata_do_replace 
    (MF_REPLACEMENT_DATA_t *rd, size_t to_position)
{
    unsigned int index;
    struct mf_replacement_nominee *nom;
    size_t base_position = rd->trie->base_position;
    
    if (to_position < base_position)
        return;
    
    /* Replace the candidate patterns */
    if (rd->noms_size > 0)
    {
        for (index = 0; index < rd->noms_size; index++)
        {
            nom = &rd->noms[index];
            
            if (to_position <= (nom->position - nom->pattern->ptext.length))
                break;
            
            /* Append the space before pattern */
            mf_repdata_appendfactor (rd, rd->curser, /* from */
                    nom->position - nom->pattern->ptext.length /* to */);
            
            /* Append the replacement instead of the pattern */
            mf_repdata_appendtext(rd, &nom->pattern->rtext);
            
            rd->curser = nom->position;
        }
        rd->noms_size -= index;
        
        /* Shift the array to the left to eliminate the consumed nominees */
        if (rd->noms_size && index)
        {
            memcpy (&rd->noms[0], &rd->noms[index], 
                    rd->noms_size * sizeof(struct mf_replacement_nominee));
            /* TODO: implement a circular queue */
        }
    }
    
    /* Append the chunk between the last pattern and to_position */
    if (to_position > rd->curser)
    {
        mf_repdata_appendfactor (rd, rd->curser, to_position);
        
        rd->curser = to_position;
    }
    
    if (base_position <= rd->curser)
    {
        /* we consume the whole backlog or none of it */
        rd->backlog.length = 0;
    }
}